

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ulong uVar2;
  uint seed;
  
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  uVar2 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"random seed is %u",uVar2 & 0xffffffff);
  fprintf(_stdout,"\n");
  srand((uint)uVar2);
  check_aug();
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int main()
{
	plan(1);
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	check_aug();

	footer();
	return check_plan();
}